

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O0

bufsize_t AbstractFileBuffer::getReadableSize(QString *path)

{
  byte bVar1;
  qsizetype qVar2;
  bufsize_t size;
  QFlags<QIODeviceBase::OpenModeFlag> local_2c;
  QFile local_28 [8];
  QFile fIn;
  QString *path_local;
  
  qVar2 = QString::length(path);
  if (qVar2 == 0) {
    path_local = (QString *)0x0;
  }
  else {
    QFile::QFile(local_28,(QString *)path);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_2c,ReadOnly);
    bVar1 = QFile::open((QFlags_conflict *)local_28);
    if ((bVar1 & 1) == 0) {
      path_local = (QString *)0x0;
    }
    else {
      path_local = (QString *)getReadableSize(local_28);
      QFileDevice::close();
    }
    QFile::~QFile(local_28);
  }
  return (bufsize_t)path_local;
}

Assistant:

bufsize_t AbstractFileBuffer::getReadableSize(const QString &path)
{
    if (!path.length()) return 0;
    QFile fIn(path);
    if (!fIn.open(QIODevice::ReadOnly)) return 0;
    const bufsize_t size = getReadableSize(fIn);
    fIn.close();
    return size;
}